

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateEmptyString_abi_cxx11_(Tables *this)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **in_RDI;
  string *result;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  std::
  vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
  ::emplace_back<std::__cxx11::string*&>
            ((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)this_00,in_RDI);
  return this_00;
}

Assistant:

std::string* DescriptorPool::Tables::AllocateEmptyString() {
  std::string* result = new std::string();
  strings_.emplace_back(result);
  return result;
}